

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O3

void __thiscall zsummer::log4z::CLogerManager::Run(CLogerManager *this)

{
  int iVar1;
  FILE *__stream;
  char *__s;
  bool bVar2;
  ostream *poVar3;
  tm *ptVar4;
  size_t len;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool *pbVar12;
  int i;
  LoggerInfo *pLVar13;
  long lVar14;
  LogData *pLog;
  char *local_258;
  _List_node_base *local_250;
  bool *local_248;
  CLogerManager *local_240;
  LoggerInfo *local_238;
  time_t local_230;
  time_t local_228;
  tm tm2;
  int needFlush [10];
  stringstream ss;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  char *local_188;
  ios_base local_138 [264];
  
  this->m_bRuning = true;
  pbVar12 = &this->m_loggers[0]._enable;
  this->m_loggers[0]._enable = true;
  lVar14 = 0;
  (*(this->super_CThread)._vptr_CThread[8])
            (this,0,4,"-----------------  log thread runing...   ----------------------------");
  do {
    if (*pbVar12 == true) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," logger id=",0xb);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)lVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," path=",6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(((string *)(pbVar12 + -0x2c))->_M_dataplus)._M_p,
                          *(size_type *)(pbVar12 + -0x24));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," name=",6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(((LoggerInfo *)(pbVar12 + -0x6c))->_name)._M_dataplus._M_p,
                          *(size_type *)(pbVar12 + -100));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," level=",7);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(pbVar12 + -0xc));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," display=",9);
      std::ostream::_M_insert<bool>(SUB81(poVar3,0));
      std::__cxx11::stringbuf::str();
      (*(this->super_CThread)._vptr_CThread[8])(this,0,4,tm2._0_8_);
      if ((int *)tm2._0_8_ != &tm2.tm_mon) {
        operator_delete((void *)tm2._0_8_,CONCAT44(tm2.tm_year,tm2.tm_mon) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
    }
    lVar14 = lVar14 + 1;
    pbVar12 = pbVar12 + 0x88;
  } while (lVar14 != 10);
  sem_post((sem_t *)&(this->m_semaphore).m_semid);
  pLog = (LogData *)0x0;
  local_258 = (char *)operator_new__(0xa00);
  needFlush[8] = 0;
  needFlush[9] = 0;
  needFlush[4] = 0;
  needFlush[5] = 0;
  needFlush[6] = 0;
  needFlush[7] = 0;
  needFlush[0] = 0;
  needFlush[1] = 0;
  needFlush[2] = 0;
  needFlush[3] = 0;
  local_250 = (_List_node_base *)&this->m_logs;
  local_248 = &this->m_loggers[0]._enable;
  pLVar13 = this->m_loggers;
  local_240 = this;
  local_238 = this->m_loggers;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar2 = PopLog(this,&pLog);
          if (bVar2) break;
          lVar14 = 0;
          pbVar12 = local_248;
          do {
            if ((*pbVar12 == true) && (0 < needFlush[lVar14])) {
              if ((FILE *)((CLog4zFile *)(pbVar12 + 0x14))->m_file != (FILE *)0x0) {
                fflush((FILE *)((CLog4zFile *)(pbVar12 + 0x14))->m_file);
              }
              needFlush[lVar14] = 0;
            }
            lVar14 = lVar14 + 1;
            pbVar12 = pbVar12 + 0x88;
          } while (lVar14 != 10);
          if ((this->m_bRuning == false) &&
             ((this->m_logs).
              super__List_base<zsummer::log4z::LogData_*,_std::allocator<zsummer::log4z::LogData_*>_>
              ._M_impl._M_node.super__List_node_base._M_next == local_250)) {
            lVar14 = 0x128;
            do {
              if (*(char *)((long)this + lVar14 + -0x14) == '\x01') {
                *(undefined1 *)((long)this + lVar14 + -0x14) = 0;
                __stream = *(FILE **)((long)&(this->super_CThread)._vptr_CThread + lVar14);
                if (__stream != (FILE *)0x0) {
                  fclose(__stream);
                  *(undefined8 *)((long)&(this->super_CThread)._vptr_CThread + lVar14) = 0;
                }
              }
              lVar14 = lVar14 + 0x88;
            } while (lVar14 != 0x678);
            operator_delete__(local_258);
            return;
          }
          usleep(100000);
        }
        this->m_ullStatusTotalPopLog = this->m_ullStatusTotalPopLog + 1;
        iVar1 = pLog->_id;
        if ((pLVar13[iVar1]._enable == true) && (pLVar13[iVar1]._level <= pLog->_level)) break;
        operator_delete(pLog,0x818);
        pLog = (LogData *)0x0;
      }
      local_228 = pLog->_time;
      local_230 = pLVar13[iVar1]._curFileCreateTime;
      localtime_r(&local_228,(tm *)&ss);
      localtime_r(&local_230,(tm *)&tm2);
      if ((local_1a8._4_4_ != tm2.tm_year) || (bVar2 = true, local_1a8._12_4_ != tm2.tm_yday)) {
        bVar2 = false;
      }
      uVar5 = pLVar13[iVar1]._limitsize << 0x14;
      if ((bool)(bVar2 ^ 1U | pLVar13[iVar1]._handle.m_file == (FILE *)0x0 |
                uVar5 < pLVar13[iVar1]._curWriteLen)) break;
LAB_0011de5a:
      ptVar4 = localtime_r(&pLog->_time,(tm *)&ss);
      __s = local_258;
      if (ptVar4 == (tm *)0x0) {
        local_198 = (undefined1  [16])0x0;
        local_1a8 = (undefined1  [16])0x0;
        _ss = (undefined1  [16])0x0;
        local_188 = (char *)0x0;
        uVar7 = 0x76c;
        uVar6 = 1;
        uVar10 = 0;
        uVar11 = 0;
        uVar9 = 0;
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)uStack_1ac;
        uVar9 = (ulong)uStack_1b0;
        uVar10 = (ulong)_ss;
        uVar11 = (ulong)uStack_1b4;
        uVar7 = (ulong)(local_1a8._4_4_ + 0x76c);
        uVar6 = (ulong)(local_1a8._0_4_ + 1);
      }
      sprintf(local_258,"%d-%02d-%02d %02d:%02d:%02d.%03d %s %s \r\n",uVar7,uVar6,uVar8,uVar9,uVar11
              ,uVar10,(ulong)pLog->_precise,*(undefined8 *)(LOG_STRING + (long)pLog->_level * 8),
              pLog->_content);
      len = strlen(__s);
      CLog4zFile::Write(&pLVar13[iVar1]._handle,__s,len);
      this = local_240;
      pLVar13[iVar1]._curWriteLen = pLVar13[iVar1]._curWriteLen + (int)len;
      needFlush[pLog->_id] = needFlush[pLog->_id] + 1;
      local_240->m_ullStatusTotalWriteFileCount = local_240->m_ullStatusTotalWriteFileCount + 1;
      local_240->m_ullStatusTotalWriteFileBytes = len + local_240->m_ullStatusTotalWriteFileBytes;
      operator_delete(pLog,0x818);
      pLog = (LogData *)0x0;
      pLVar13 = local_238;
    }
    if (bVar2) {
      if (uVar5 < pLVar13[iVar1]._curWriteLen) {
        pLVar13[iVar1]._curFileIndex = pLVar13[iVar1]._curFileIndex + 1;
        goto LAB_0011de33;
      }
    }
    else {
      pLVar13[iVar1]._curFileIndex = 0;
LAB_0011de33:
      pLVar13[iVar1]._curWriteLen = 0;
    }
    pLVar13[iVar1]._curFileCreateTime = pLog->_time;
    bVar2 = OpenLogger(this,pLog->_id);
    if (bVar2) goto LAB_0011de5a;
    pLVar13[iVar1]._enable = false;
    operator_delete(pLog,0x818);
    pLog = (LogData *)0x0;
    printf("%s%s\x1b[0m",0x131dca,"log4z: Run can not update file, open file false! \r\n");
  } while( true );
}

Assistant:

virtual void Run()
	{
		m_bRuning = true;
		m_loggers[LOG4Z_MAIN_LOGGER_ID]._enable = true;
		PushLog(0, LOG_LEVEL_ALARM, "-----------------  log thread runing...   ----------------------------");
		for (int i=0; i<LOG4Z_LOGGER_MAX; i++)
		{
			if (m_loggers[i]._enable)
			{
				std::stringstream ss;
				ss <<" logger id=" <<i
				   <<" path=" <<m_loggers[i]._path
				   <<" name=" <<m_loggers[i]._name
				   <<" level=" << m_loggers[i]._level
				   <<" display=" << m_loggers[i]._display;
				PushLog(0, LOG_LEVEL_ALARM, ss.str().c_str());
			}
		}

		m_semaphore.Post();


		LogData * pLog = NULL;
		char *pWriteBuf = new char[LOG4Z_LOG_BUF_SIZE + 512];
		int needFlush[LOG4Z_LOGGER_MAX] = {0};
		while (true)
		{
			while(PopLog(pLog))
			{
				//
				m_ullStatusTotalPopLog ++;
				//discard
				LoggerInfo & curLogger = m_loggers[pLog->_id];
				if (!curLogger._enable || pLog->_level <curLogger._level  )
				{
					delete pLog;
					pLog = NULL;
					continue;
				}

				//update file
				if (LOG4Z_WRITE_TO_FILE)
				{
					bool sameday = IsSameDay(pLog->_time, curLogger._curFileCreateTime);
					bool needChageFile = curLogger._curWriteLen > curLogger._limitsize*1024*1024;
					if (!curLogger._handle.IsOpen()
						|| !sameday
						|| needChageFile)
					{
						if (!sameday)
						{
							curLogger._curFileIndex = 0;
							curLogger._curWriteLen = 0;
						}
						else if ( needChageFile)
						{
							curLogger._curFileIndex ++;
							curLogger._curWriteLen = 0;
						}
						curLogger._curFileCreateTime = pLog->_time;
						if (!OpenLogger(pLog->_id))
						{
							curLogger._enable = false;
							delete pLog;
							pLog = NULL;
							ShowColorText("log4z: Run can not update file, open file false! \r\n", LOG_LEVEL_FATAL);
							continue;
						}
					}
				}

				//record
				tm tt;
				if (!TimeToTm(pLog->_time, &tt))
				{
					memset(&tt, 0, sizeof(tt));
				}
				sprintf(pWriteBuf, "%d-%02d-%02d %02d:%02d:%02d.%03d %s %s \r\n",
					tt.tm_year+1900, tt.tm_mon+1, tt.tm_mday, tt.tm_hour, tt.tm_min, tt.tm_sec, pLog->_precise,
					LOG_STRING[pLog->_level], pLog->_content);

				if (LOG4Z_WRITE_TO_FILE)
				{
					size_t writeLen = strlen(pWriteBuf);
					curLogger._handle.Write(pWriteBuf, writeLen);
					curLogger._curWriteLen += (unsigned int)writeLen;
					needFlush[pLog->_id] ++;
					m_ullStatusTotalWriteFileCount++;
					m_ullStatusTotalWriteFileBytes += writeLen;
				}
				else
				{
					size_t writeLen = strlen(pWriteBuf);
					m_ullStatusTotalWriteFileCount++;
					m_ullStatusTotalWriteFileBytes += writeLen;
				}

				if (curLogger._display && !LOG4Z_SYNCHRONOUS_DISPLAY)
				{
					ShowColorText(pWriteBuf, pLog->_level);
				}



				delete pLog;
				pLog = NULL;
			}

			for (int i=0; i<LOG4Z_LOGGER_MAX; i++)
			{
				if (m_loggers[i]._enable && needFlush[i] > 0)
				{
					m_loggers[i]._handle.Flush();
					needFlush[i] = 0;
				}
			}

			//! quit
			if (!m_bRuning && m_logs.empty())
			{
				break;
			}
			//! delay.
			SleepMillisecond(100);
		}

		for (int i=0; i<LOG4Z_LOGGER_MAX; i++)
		{
			if (m_loggers[i]._enable)
			{
				m_loggers[i]._enable = false;
				m_loggers[i]._handle.Close();
			}
		}
		delete []pWriteBuf;
		pWriteBuf = NULL;

	}